

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Singleton.h
# Opt level: O0

void __thiscall
axl::sl::ConstructSingleton<axl::sl::StringHashTable<void_(*)()>_>::operator()
          (ConstructSingleton<axl::sl::StringHashTable<void_(*)()>_> *this,void *p)

{
  Module *this_00;
  StringHashTable<void_(*)()> *p_00;
  Module *in_RSI;
  Ptr<axl::g::Finalizer> *in_stack_ffffffffffffffd0;
  Ptr<axl::g::Finalizer> *in_stack_ffffffffffffffe8;
  
  StringHashTable<void_(*)()>::StringHashTable((StringHashTable<void_(*)()> *)0x108dc8);
  this_00 = g::getModule();
  p_00 = (StringHashTable<void_(*)()> *)mem::allocate(0x108ddc);
  DestructSingleton<axl::sl::StringHashTable<void_(*)()>_>::DestructSingleton
            ((DestructSingleton<axl::sl::StringHashTable<void_(*)()>_> *)this_00,p_00);
  rc::primeRefCount<axl::sl::DestructSingleton<axl::sl::StringHashTable<void(*)()>>>
            ((DestructSingleton<axl::sl::StringHashTable<void_(*)()>_> *)this_00,(FreeFunc *)p_00);
  rc::Ptr<axl::g::Finalizer>::Ptr<axl::sl::DestructSingleton<axl::sl::StringHashTable<void(*)()>>>
            (in_stack_ffffffffffffffd0,
             (DestructSingleton<axl::sl::StringHashTable<void_(*)()>_> *)&stack0xffffffffffffffe0);
  g::Module::addFinalizer(in_RSI,in_stack_ffffffffffffffe8);
  rc::Ptr<axl::g::Finalizer>::~Ptr((Ptr<axl::g::Finalizer> *)0x108e2a);
  return;
}

Assistant:

void
	operator () (void* p) {
		new(p)T;
		g::getModule()->addFinalizer(AXL_RC_NEW_ARGS(Destruct, ((T*)p)));
	}